

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *p_data,char *format)

{
  undefined1 uVar1;
  undefined2 uVar2;
  int iVar3;
  float fVar4;
  byte bVar5;
  ulong uVar6;
  double dVar7;
  int arg0i;
  float arg1f;
  int arg1i;
  ImGuiDataTypeTempStorage data_backup;
  double local_68;
  undefined8 local_60;
  size_t local_58;
  double *local_50;
  float local_44;
  char *local_40;
  undefined1 local_38 [8];
  
  while( true ) {
    bVar5 = *buf;
    uVar6 = (ulong)bVar5;
    if (0x2f < uVar6) break;
    if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0x8c0000000000U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_001586ae;
      break;
    }
    buf = (char *)((byte *)buf + 1);
  }
  bVar5 = 0;
LAB_001586c4:
  if (*buf == 0) {
    return false;
  }
  local_58 = GDataTypeInfo[data_type].Size;
  local_50 = (double *)p_data;
  local_40 = initial_value_buf;
  memcpy(local_38,p_data,local_58);
  if (format == (char *)0x0) {
    format = GDataTypeInfo[data_type].ScanFmt;
  }
  local_44 = 0.0;
  if (data_type == 9) {
    local_68 = *local_50;
    local_60 = 0.0;
    if ((bVar5 != 0) && (iVar3 = __isoc99_sscanf(local_40,"%lf",&local_68), iVar3 < 1)) {
      return false;
    }
    iVar3 = __isoc99_sscanf(buf,"%lf",&local_60);
    if (iVar3 < 1) {
      return false;
    }
    if (bVar5 == 0x2a) {
      dVar7 = local_68 * local_60;
    }
    else if (bVar5 == 0x2f) {
      if ((local_60 == 0.0) && (!NAN(local_60))) goto switchD_0015891e_default;
      dVar7 = local_68 / local_60;
    }
    else {
      dVar7 = local_60;
      if (bVar5 == 0x2b) {
        dVar7 = local_68 + local_60;
      }
    }
    *local_50 = dVar7;
    goto switchD_0015891e_default;
  }
  if (data_type == 8) {
    local_68 = (double)CONCAT44(local_68._4_4_,*(float *)local_50);
    local_60 = (double)((ulong)local_60._4_4_ << 0x20);
    if ((bVar5 != 0) && (iVar3 = __isoc99_sscanf(local_40,"%f",&local_68), iVar3 < 1)) {
      return false;
    }
    iVar3 = __isoc99_sscanf(buf,"%f",&local_60);
    if (iVar3 < 1) {
      return false;
    }
    if (bVar5 == 0x2a) {
      fVar4 = local_68._0_4_ * (float)local_60;
    }
    else if (bVar5 == 0x2f) {
      if (((float)local_60 == 0.0) && (!NAN((float)local_60))) goto switchD_0015891e_default;
      fVar4 = local_68._0_4_ / (float)local_60;
    }
    else {
      fVar4 = (float)local_60;
      if (bVar5 == 0x2b) {
        fVar4 = local_68._0_4_ + (float)local_60;
      }
    }
    *(float *)local_50 = fVar4;
    goto switchD_0015891e_default;
  }
  if (data_type == 4) {
    local_68 = (double)CONCAT44(local_68._4_4_,*(float *)local_50);
    local_60 = (double)((ulong)local_60._4_4_ << 0x20);
    if (bVar5 == 0) {
LAB_0015893e:
      iVar3 = __isoc99_sscanf(buf,format,&local_44);
      fVar4 = local_44;
      if (iVar3 != 1) goto switchD_0015891e_default;
    }
    else {
      iVar3 = __isoc99_sscanf(local_40,format,&local_68);
      if (iVar3 < 1) {
        return false;
      }
      if (bVar5 == 0x2a) {
        iVar3 = __isoc99_sscanf(buf,"%f",&local_60);
        if (iVar3 == 0) goto switchD_0015891e_default;
        fVar4 = (float)(int)((float)(int)local_68._0_4_ * (float)local_60);
      }
      else if (bVar5 == 0x2f) {
        iVar3 = __isoc99_sscanf(buf,"%f",&local_60);
        if (iVar3 == 0) goto switchD_0015891e_default;
        if (((float)local_60 == 0.0) && (!NAN((float)local_60))) goto switchD_0015891e_default;
        fVar4 = (float)(int)((float)(int)local_68._0_4_ / (float)local_60);
      }
      else {
        if (bVar5 != 0x2b) goto LAB_0015893e;
        iVar3 = __isoc99_sscanf(buf,"%d",&local_44);
        if (iVar3 == 0) goto switchD_0015891e_default;
        fVar4 = (float)((int)local_44 + (int)local_68._0_4_);
      }
    }
    *(float *)local_50 = fVar4;
    goto switchD_0015891e_default;
  }
  if (data_type - 5U < 3) {
    __isoc99_sscanf(buf,format);
    goto switchD_0015891e_default;
  }
  __isoc99_sscanf(buf,format,&local_68);
  switch(data_type) {
  case 0:
    iVar3 = 0x7f;
    if ((int)local_68._0_4_ < 0x7f) {
      iVar3 = (int)local_68._0_4_;
    }
    uVar1 = 0x80;
    if (-0x80 < iVar3) {
      uVar1 = (undefined1)iVar3;
    }
    break;
  case 1:
    iVar3 = 0xff;
    if ((int)local_68._0_4_ < 0xff) {
      iVar3 = (int)local_68._0_4_;
    }
    uVar1 = 0;
    if (0 < iVar3) {
      uVar1 = (undefined1)iVar3;
    }
    break;
  case 2:
    iVar3 = 0x7fff;
    if ((int)local_68._0_4_ < 0x7fff) {
      iVar3 = (int)local_68._0_4_;
    }
    uVar2 = 0x8000;
    if (-0x8000 < iVar3) {
      uVar2 = (undefined2)iVar3;
    }
    goto LAB_00158a3d;
  case 3:
    iVar3 = 0xffff;
    if ((int)local_68._0_4_ < 0xffff) {
      iVar3 = (int)local_68._0_4_;
    }
    uVar2 = 0;
    if (0 < iVar3) {
      uVar2 = (undefined2)iVar3;
    }
LAB_00158a3d:
    *(undefined2 *)local_50 = uVar2;
  default:
    goto switchD_0015891e_default;
  }
  *(undefined1 *)local_50 = uVar1;
switchD_0015891e_default:
  iVar3 = bcmp(local_38,local_50,local_58);
  return iVar3 != 0;
LAB_001586ae:
  do {
    do {
      buf = (char *)((byte *)buf + 1);
    } while (*buf == 0x20);
  } while (*buf == 9);
  goto LAB_001586c4;
}

Assistant:

bool ImGui::DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    const ImGuiDataTypeInfo* type_info = DataTypeGetInfo(data_type);
    ImGuiDataTypeTempStorage data_backup;
    memcpy(&data_backup, p_data, type_info->Size);

    if (format == NULL)
        format = type_info->ScanFmt;

    // FIXME-LEGACY: The aim is to remove those operators and write a proper expression evaluator at some point..
    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)p_data;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)p_data;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)p_data;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // All other types assign constant
        // We don't bother handling support for legacy operators since they are a little too crappy. Instead we will later implement a proper expression evaluator in the future.
        sscanf(buf, format, p_data);
    }
    else
    {
        // Small types need a 32-bit buffer to receive the result from scanf()
        int v32;
        sscanf(buf, format, &v32);
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(&data_backup, p_data, type_info->Size) != 0;
}